

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  LogMessage *other;
  Type *pTVar4;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (this->current_size_ < 1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x7ec);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_21,other);
    LogMessage::~LogMessage(&local_60);
  }
  pRVar3 = this->rep_;
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + -1;
  pTVar4 = (Type *)pRVar3->elements[(long)iVar1 + -1];
  iVar2 = pRVar3->allocated_size;
  pRVar3->allocated_size = iVar2 + -1;
  if (iVar1 < iVar2) {
    pRVar3->elements[(long)iVar1 + -1] = pRVar3->elements[(long)iVar2 + -1];
  }
  if (this->arena_ != (Arena *)0x0) {
    pTVar4 = (Type *)operator_new(0x20);
    (pTVar4->_M_dataplus)._M_p = (pointer)&pTVar4->field_2;
    pTVar4->_M_string_length = 0;
    (pTVar4->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)pTVar4);
  }
  return pTVar4;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseLastInternal(
    std::true_type) {
  // First, release an element.
  typename TypeHandler::Type* result = UnsafeArenaReleaseLast<TypeHandler>();
  // Now perform a copy if we're on an arena.
  Arena* arena = GetArena();
  if (arena == NULL) {
    return result;
  } else {
    typename TypeHandler::Type* new_result =
        TypeHandler::NewFromPrototype(result, NULL);
    TypeHandler::Merge(*result, new_result);
    return new_result;
  }
}